

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

void * KINCreate(SUNContext_conflict sunctx)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  int line;
  char *msgfmt;
  
  if (sunctx == (SUNContext_conflict)0x0) {
    msgfmt = "sunctx = NULL illegal.";
    line = 0xdb;
  }
  else {
    puVar2 = (undefined8 *)calloc(1,0x2a0);
    if (puVar2 != (undefined8 *)0x0) {
      *puVar2 = sunctx;
      puVar2[1] = 0x3cb0000000000000;
      puVar2[0x2d] = 0x3ff0000000000000;
      puVar2[0x33] = 0x3ff0000000000000;
      puVar2[7] = 200;
      puVar2[8] = 10;
      puVar2[9] = 5;
      puVar2[10] = 10;
      puVar2[0x19] = 0x4000000000000000;
      puVar2[0x11] = 0x3e50000000000000;
      uVar1 = SUNRpowerR(0,0x55555556);
      puVar2[5] = uVar1;
      uVar1 = SUNRpowerR(0);
      puVar2[4] = uVar1;
      *(undefined4 *)(puVar2 + 0xb) = 1;
      puVar2[0x17] = 0x4000000000000000;
      puVar2[0x15] = 0x3fb999999999999a;
      puVar2[0x16] = 0x3feccccccccccccd;
      *(undefined4 *)(puVar2 + 0x53) = 0;
      *(undefined4 *)(puVar2 + 0x4f) = 1;
      *(undefined4 *)(puVar2 + 0x50) = 0;
      *(undefined4 *)((long)puVar2 + 0x284) = 0;
      *(undefined4 *)(puVar2 + 0x51) = 0x88e368f1;
      *(undefined4 *)((long)puVar2 + 0x28c) = 0x3ee4f8b5;
      puVar2[0x52] = 0x3feccccccccccccd;
      puVar2[0x42] = 0x11;
      puVar2[0x43] = 0x16;
      puVar2[0x40] = 0;
      puVar2[0x41] = 0;
      return puVar2;
    }
    msgfmt = "A memory request failed.";
    line = 0xe3;
  }
  KINProcessError((KINMem)0x0,0,line,"KINCreate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol.c"
                  ,msgfmt);
  return (void *)0x0;
}

Assistant:

void* KINCreate(SUNContext sunctx)
{
  KINMem kin_mem;
  sunrealtype uround;

  /* Test inputs */
  if (sunctx == NULL)
  {
    KINProcessError(NULL, 0, __LINE__, __func__, __FILE__, MSG_NULL_SUNCTX);
    return (NULL);
  }

  kin_mem = NULL;
  kin_mem = (KINMem)malloc(sizeof(struct KINMemRec));
  if (kin_mem == NULL)
  {
    KINProcessError(kin_mem, 0, __LINE__, __func__, __FILE__, MSG_MEM_FAIL);
    return (NULL);
  }

  /* Zero out kin_mem */
  memset(kin_mem, 0, sizeof(struct KINMemRec));

  kin_mem->kin_sunctx = sunctx;

  /* set uround (unit roundoff) */

  kin_mem->kin_uround = uround = SUN_UNIT_ROUNDOFF;

  /* set default values for solver optional inputs */

  kin_mem->kin_func             = NULL;
  kin_mem->kin_user_data        = NULL;
  kin_mem->kin_uu               = NULL;
  kin_mem->kin_unew             = NULL;
  kin_mem->kin_fval             = NULL;
  kin_mem->kin_gval             = NULL;
  kin_mem->kin_uscale           = NULL;
  kin_mem->kin_fscale           = NULL;
  kin_mem->kin_pp               = NULL;
  kin_mem->kin_constraints      = NULL;
  kin_mem->kin_vtemp1           = NULL;
  kin_mem->kin_vtemp2           = NULL;
  kin_mem->kin_vtemp3           = NULL;
  kin_mem->kin_fold_aa          = NULL;
  kin_mem->kin_gold_aa          = NULL;
  kin_mem->kin_df_aa            = NULL;
  kin_mem->kin_dg_aa            = NULL;
  kin_mem->kin_q_aa             = NULL;
  kin_mem->kin_T_aa             = NULL;
  kin_mem->kin_gamma_aa         = NULL;
  kin_mem->kin_R_aa             = NULL;
  kin_mem->kin_ipt_map          = NULL;
  kin_mem->kin_cv               = NULL;
  kin_mem->kin_Xv               = NULL;
  kin_mem->kin_lmem             = NULL;
  kin_mem->kin_beta             = ONE;
  kin_mem->kin_damping          = SUNFALSE;
  kin_mem->kin_m_aa             = 0;
  kin_mem->kin_delay_aa         = 0;
  kin_mem->kin_orth_aa          = KIN_ORTH_MGS;
  kin_mem->kin_qr_func          = NULL;
  kin_mem->kin_qr_data          = NULL;
  kin_mem->kin_beta_aa          = ONE;
  kin_mem->kin_damping_aa       = SUNFALSE;
  kin_mem->kin_constraintsSet   = SUNFALSE;
  kin_mem->kin_ret_newest       = SUNFALSE;
  kin_mem->kin_mxiter           = MXITER_DEFAULT;
  kin_mem->kin_noInitSetup      = SUNFALSE;
  kin_mem->kin_msbset           = MSBSET_DEFAULT;
  kin_mem->kin_noResMon         = SUNFALSE;
  kin_mem->kin_msbset_sub       = MSBSET_SUB_DEFAULT;
  kin_mem->kin_update_fnorm_sub = SUNFALSE;
  kin_mem->kin_mxnbcf           = MXNBCF_DEFAULT;
  kin_mem->kin_sthrsh           = TWO;
  kin_mem->kin_noMinEps         = SUNFALSE;
  kin_mem->kin_mxnstepin        = ZERO;
  kin_mem->kin_sqrt_relfunc     = SUNRsqrt(uround);
  kin_mem->kin_scsteptol        = SUNRpowerR(uround, TWOTHIRDS);
  kin_mem->kin_fnormtol         = SUNRpowerR(uround, ONETHIRD);
  kin_mem->kin_etaflag          = KIN_ETACHOICE1;
  kin_mem->kin_eta              = POINT1; /* default for KIN_ETACONSTANT */
  kin_mem->kin_eta_alpha        = TWO;    /* default for KIN_ETACHOICE2  */
  kin_mem->kin_eta_gamma        = POINT9; /* default for KIN_ETACHOICE2  */
  kin_mem->kin_MallocDone       = SUNFALSE;
  kin_mem->kin_eval_omega       = SUNTRUE;
  kin_mem->kin_omega            = ZERO; /* default to using min/max    */
  kin_mem->kin_omega_min        = OMEGA_MIN;
  kin_mem->kin_omega_max        = OMEGA_MAX;

  /* initialize lrw and liw */

  kin_mem->kin_lrw = 17;
  kin_mem->kin_liw = 22;

  /* NOTE: needed since KINInit could be called after KINSetConstraints */

  kin_mem->kin_lrw1 = 0;
  kin_mem->kin_liw1 = 0;

  return ((void*)kin_mem);
}